

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

bool __thiscall cmGeneratorTarget::IsAppBundleOnApple(cmGeneratorTarget *this)

{
  cmMakefile *this_00;
  bool bVar1;
  bool bVar2;
  TargetType TVar3;
  string local_70;
  string local_50;
  
  TVar3 = cmTarget::GetType(this->Target);
  if (TVar3 == EXECUTABLE) {
    this_00 = this->Makefile;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"APPLE","");
    bVar1 = cmMakefile::IsOn(this_00,&local_50);
    if (bVar1) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"MACOSX_BUNDLE","");
      bVar2 = cmTarget::GetPropertyAsBool(this->Target,&local_70);
      bVar1 = true;
      goto LAB_0039d822;
    }
  }
  bVar1 = false;
  bVar2 = false;
LAB_0039d822:
  if ((bVar1) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2)) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((TVar3 == EXECUTABLE) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2)) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool cmGeneratorTarget::IsAppBundleOnApple() const
{
  return (this->GetType() == cmStateEnums::EXECUTABLE &&
          this->Makefile->IsOn("APPLE") &&
          this->GetPropertyAsBool("MACOSX_BUNDLE"));
}